

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void * lua_touserdata(lua_State *L,int idx)

{
  TValue *pTVar1;
  GCObject *pGVar2;
  uint uVar3;
  
  pTVar1 = index2addr(L,idx);
  uVar3 = pTVar1->tt_ & 0xf;
  if (uVar3 == 2) {
    pGVar2 = (pTVar1->value_).gc;
  }
  else if (uVar3 == 7) {
    pGVar2 = (GCObject *)((pTVar1->value_).f + 0x28);
  }
  else {
    pGVar2 = (GCObject *)0x0;
  }
  return pGVar2;
}

Assistant:

LUA_API void *lua_touserdata(lua_State *L, int idx) {
    StkId o = index2addr(L, idx);
    switch (ttnov(o)) {
        case LUA_TUSERDATA:
            return getudatamem(uvalue(o));
        case LUA_TLIGHTUSERDATA:
            return pvalue(o);
        default:
            return NULL;
    }
}